

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  _Rb_tree_header *p_Var1;
  PositionType *pPVar2;
  cmGeneratorTarget *this_00;
  pointer pcVar3;
  size_t sVar4;
  cmLocalNinjaGenerator *pcVar5;
  cmLocalNinjaGenerator *this_01;
  cmMakefile *this_02;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  _func_int **pp_Var10;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar11;
  int iVar12;
  TargetType TVar13;
  int iVar14;
  cmGlobalNinjaGenerator *pcVar15;
  string *psVar16;
  char *pcVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  char *__s;
  size_t sVar20;
  mapped_type *pmVar21;
  cmGeneratedFileStream *os;
  size_type sVar22;
  cmOutputConverter *pcVar23;
  bool bVar24;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  bool usedResponseFile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  cmGeneratorTarget *local_3c0;
  cmGlobalNinjaGenerator *local_3b8;
  undefined1 local_3b0 [48];
  cmOutputConverter *local_380;
  Names tgtNames;
  string objPath;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string local_250;
  string targetOutputImplib;
  string local_210;
  string langFlags;
  string linkPath;
  string frameworkPath;
  string local_190;
  string createRule;
  undefined1 local_150 [32];
  key_type local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110 [3];
  pointer local_c8;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcStack_c0;
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcStack_a8;
  pointer local_a0;
  cmNinjaDeps local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_380 = (cmOutputConverter *)output;
  local_3b8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  local_3c0 = this_00;
  cmGeneratorTarget::GetFullPath((string *)local_150,this_00,config,ImportLibraryArtifact,false);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar16 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar15,(string *)local_150);
  targetOutputImplib._M_dataplus._M_p = (pointer)&targetOutputImplib.field_2;
  pcVar3 = (psVar16->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetOutputImplib,pcVar3,pcVar3 + psVar16->_M_string_length);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_150._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
  }
  sVar4 = config->_M_string_length;
  if (sVar4 == fileConfig->_M_string_length) {
    if (sVar4 != 0) {
      iVar12 = bcmp((config->_M_dataplus)._M_p,(fileConfig->_M_dataplus)._M_p,sVar4);
      if (iVar12 != 0) goto LAB_003a11a6;
    }
  }
  else {
LAB_003a11a6:
    pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    (*(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (&linkLineComputer,pcVar5,local_3c0);
    pcVar11 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              DirectoryState.Tree;
    pp_Var10 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
               _vptr_cmLinkLineComputer;
    (*(local_3b8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x49])(&usedResponseFile,local_3b8,fileConfig);
    local_150._0_8_ = pcVar11;
    local_150._8_8_ = pp_Var10;
    local_150._16_8_ = paStack_400;
    local_150._24_8_ = _usedResponseFile;
    local_130._M_dataplus._M_p = (pointer)0x1;
    local_130._M_string_length = 0x73d7b2;
    views._M_len = 3;
    views._M_array = (iterator)local_150;
    cmCatViews_abi_cxx11_(&tgtNames.Base,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_3f8) {
      operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
    }
    if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer !=
        (_func_int **)
        &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
         DirectoryState.Position) {
      operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      _vptr_cmLinkLineComputer,
                      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position + 1);
    }
    (*(local_3b8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x16])(local_150,local_3b8,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)&tgtNames,(string *)local_150);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_150._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    _Var9._M_p = tgtNames.Base._M_dataplus._M_p;
    sVar4 = outputDir->_M_string_length;
    if (sVar4 == tgtNames.Base._M_string_length) {
      if (sVar4 != 0) {
        iVar12 = bcmp((outputDir->_M_dataplus)._M_p,tgtNames.Base._M_dataplus._M_p,sVar4);
        if (iVar12 != 0) goto LAB_003a12ed;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &tgtNames.Base.field_2) {
        operator_delete(_Var9._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003a253e;
    }
LAB_003a12ed:
    cmGeneratorTarget::GetFullName((string *)local_150,local_3c0,config,ImportLibraryArtifact);
    if ((_func_int **)local_150._8_8_ == (_func_int **)0x0) {
      bVar24 = true;
    }
    else {
      cmGeneratorTarget::GetFullName
                ((string *)&linkLineComputer,local_3c0,fileConfig,ImportLibraryArtifact);
      if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
          DirectoryState.Tree == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0)
      {
        bVar24 = true;
      }
      else {
        cmGeneratorTarget::GetFullPath
                  ((string *)&usedResponseFile,local_3c0,fileConfig,ImportLibraryArtifact,false);
        pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar16 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar15,(string *)&usedResponseFile);
        bVar24 = true;
        if (targetOutputImplib._M_string_length == psVar16->_M_string_length) {
          if (targetOutputImplib._M_string_length == 0) {
            bVar24 = false;
          }
          else {
            iVar12 = bcmp(targetOutputImplib._M_dataplus._M_p,(psVar16->_M_dataplus)._M_p,
                          targetOutputImplib._M_string_length);
            bVar24 = iVar12 != 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_3f8) {
          operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
        }
      }
      if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
          _vptr_cmLinkLineComputer !=
          (_func_int **)
          &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
           DirectoryState.Position) {
        operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        _vptr_cmLinkLineComputer,
                        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        StateDir.DirectoryState.Position + 1);
      }
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_150._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
      operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1
                     );
    }
    if (!bVar24) goto LAB_003a253e;
  }
  LanguageLinkerDeviceRule(&local_190,this,config);
  pcVar23 = local_380;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_150._8_8_ = (_func_int **)0x0;
  local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == &local_190.field_2) {
    local_130.field_2._8_8_ = local_190.field_2._8_8_;
  }
  else {
    local_130._M_dataplus._M_p = local_190._M_dataplus._M_p;
  }
  local_130._M_string_length = local_190._M_string_length;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  p_Var1 = &local_80._M_t._M_impl.super__Rb_tree_header;
  local_80._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_150._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_150 + 0x10)
  ;
  memset(local_110,0,0x90);
  local_80._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_80._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_80._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pcVar17 = GetVisibleTypeName(this);
  tgtNames.Base.field_2._M_allocated_capacity = strlen(pcVar17);
  tgtNames.Base._M_dataplus._M_p = (pointer)0x9;
  tgtNames.Base._M_string_length = (size_type)anon_var_dwarf_141e96d;
  pPVar2 = &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
            DirectoryState.Position;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)0x1;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = CONCAT71(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position._1_7_,0x20);
  tgtNames.Output._M_dataplus._M_p = (pointer)0x1;
  tgtNames.Output.field_2._8_8_ = (pcVar23->StateSnapshot).State;
  tgtNames.Output.field_2._M_allocated_capacity = (size_type)(pcVar23->StateSnapshot).Position.Tree;
  views_00._M_len = 4;
  views_00._M_array = (iterator)&tgtNames;
  tgtNames.Base.field_2._8_8_ = pcVar17;
  tgtNames.Output._M_string_length = (size_type)pPVar2;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)pPVar2;
  cmCatViews_abi_cxx11_((string *)&usedResponseFile,views_00);
  std::__cxx11::string::operator=((string *)local_150,(string *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_110,(value_type *)pcVar23);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,config);
  tgtNames.Base.field_2._M_allocated_capacity = (size_type)local_b8;
  tgtNames.Base._M_string_length = (size_type)pcStack_c0;
  tgtNames.Base._M_dataplus._M_p = (pointer)local_c8;
  local_b8 = (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position;
  local_c8 = (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      _vptr_cmLinkLineComputer;
  pcStack_c0 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
               DirectoryState.Tree;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,&tgtNames.Base,
             config,false);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = (PositionType)local_a0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = pcStack_a8;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)local_b0;
  local_a0 = (pointer)local_3f8._M_allocated_capacity;
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_usedResponseFile;
  pcStack_a8 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)paStack_400;
  _usedResponseFile = (pointer)0x0;
  paStack_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_3f8._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,local_3c0,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar23 = &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  source._M_str = (char *)(local_380->StateSnapshot).State;
  source._M_len = (size_t)(local_380->StateSnapshot).Position.Tree;
  local_380 = pcVar23;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&tgtNames.Base,pcVar23,source,SHELL);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)pPVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"TARGET_FILE","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&linkLineComputer);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&tgtNames);
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar2) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar23 = &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_01 == (cmLocalNinjaGenerator *)0x0) {
    pcVar23 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&tgtNames,(cmStateSnapshot *)&usedResponseFile);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,pcVar23,(cmStateDirectory *)&tgtNames,local_3b8);
  iVar12 = (*(local_3b8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x26])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar12,0));
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LINK_LIBRARIES","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,&tgtNames.Base);
  _usedResponseFile = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&usedResponseFile);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar5,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             pmVar18,pmVar19,&frameworkPath,&linkPath,local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&tgtNames.Base,local_3c0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  _usedResponseFile = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&usedResponseFile);
  cmGlobalNinjaGenerator::EncodeLiteral(&tgtNames.Base,local_3b8,pmVar18);
  local_3b0._0_8_ = local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"LINK_FLAGS","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)local_3b0);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&tgtNames);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3b0._0_8_ !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3b0 + 0x10)) {
    operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  cmCommonTargetGenerator::GetManifests(&tgtNames.Base,(cmCommonTargetGenerator *)this,config);
  _usedResponseFile = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"MANIFESTS","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&tgtNames.Base,&frameworkPath,&linkPath);
  _usedResponseFile = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"CUDA","");
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar5,&langFlags,local_3c0,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LANGUAGE_COMPILE_FLAGS","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,&tgtNames.Base);
  std::__cxx11::string::_M_assign((string *)pmVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  TargetNames(&tgtNames,this,config);
  bVar24 = cmGeneratorTarget::HasSOName(local_3c0,config);
  if (bVar24) {
    this_02 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&usedResponseFile,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    __s = cmMakefile::GetSONameFlag(this_02,(string *)&usedResponseFile);
    local_3b0._0_8_ = local_3b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"SONAME_FLAG","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_80,(key_type *)local_3b0);
    pcVar17 = (char *)pmVar18->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar18,0,pcVar17,(ulong)__s);
    if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
      operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_3f8) {
      operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
    }
    source_00._M_str = tgtNames.SharedObject._M_dataplus._M_p;
    source_00._M_len = tgtNames.SharedObject._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,local_380,source_00,SHELL);
    local_3b0._0_8_ = local_3b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"SONAME","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_80,(key_type *)local_3b0);
    std::__cxx11::string::operator=((string *)pmVar18,(string *)&usedResponseFile);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3b0._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3b0 + 0x10)) {
      operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_3f8) {
      operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
    }
    TVar13 = cmGeneratorTarget::GetType(local_3c0);
    if (TVar13 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&usedResponseFile,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      if (paStack_400 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        source_01._M_str = _usedResponseFile;
        source_01._M_len = (size_t)paStack_400;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_3b0,local_380,source_01,SHELL);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"INSTALLNAME_DIR","");
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_80,&objPath);
        std::__cxx11::string::operator=((string *)pmVar18,(string *)local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3b0._0_8_ !=
            (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3b0 + 0x10)) {
          operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_3f8) {
        operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
      }
    }
  }
  if (tgtNames.ImportLibrary._M_string_length != 0) {
    source_02._M_str = targetOutputImplib._M_dataplus._M_p;
    source_02._M_len = targetOutputImplib._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,local_380,source_02,SHELL);
    local_3b0._0_8_ = local_3b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"TARGET_IMPLIB","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_80,(key_type *)local_3b0);
    std::__cxx11::string::_M_assign((string *)pmVar18);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3b0._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3b0 + 0x10)) {
      operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&targetOutputImplib);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_3f8) {
      operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_3b0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  uVar8 = local_3b0._8_8_;
  uVar7 = local_3b0._0_8_;
  (*(local_3b8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
  )(&local_250,local_3b8,config);
  _usedResponseFile = (pointer)uVar8;
  paStack_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar7;
  local_3f8._M_allocated_capacity = local_250._M_string_length;
  local_3f8._8_8_ = local_250._M_dataplus._M_p;
  views_01._M_len = 2;
  views_01._M_array = (iterator)&usedResponseFile;
  cmCatViews_abi_cxx11_(&objPath,views_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3b0._0_8_ !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3b0 + 0x10)) {
    operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
  }
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar16 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar15,&objPath);
  source_03._M_str = (psVar16->_M_dataplus)._M_p;
  source_03._M_len = psVar16->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&usedResponseFile,
             &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_03,SHELL);
  local_3b0._0_8_ = local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"OBJECT_DIR","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)local_3b0);
  std::__cxx11::string::operator=((string *)pmVar18,(string *)&usedResponseFile);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,&local_80,config);
  _usedResponseFile = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_LIBRARIES","");
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  _usedResponseFile = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_80,(key_type *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_3f8) {
    operator_delete(_usedResponseFile,local_3f8._M_allocated_capacity + 1);
  }
  if (local_3b8->UsingGCCOnWindows == true) {
    sVar6 = pmVar18->_M_string_length;
    if (sVar6 != 0) {
      pcVar3 = (pmVar18->_M_dataplus)._M_p;
      sVar22 = 0;
      do {
        if (pcVar3[sVar22] == '\\') {
          pcVar3[sVar22] = '/';
        }
        sVar22 = sVar22 + 1;
      } while (sVar6 != sVar22);
    }
    sVar6 = pmVar19->_M_string_length;
    if (sVar6 != 0) {
      pcVar3 = (pmVar19->_M_dataplus)._M_p;
      sVar22 = 0;
      do {
        if (pcVar3[sVar22] == '\\') {
          pcVar3[sVar22] = '/';
        }
        sVar22 = sVar22 + 1;
      } while (sVar6 != sVar22);
    }
  }
  sVar20 = cmSystemTools::CalculateCommandLineLengthLimit();
  pmVar21 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&local_3b8->RuleCmdLength,&local_130);
  iVar12 = *pmVar21;
  psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(local_3c0);
  pcVar3 = (psVar16->_M_dataplus)._M_p;
  sVar6 = psVar16->_M_string_length;
  iVar14 = (*(local_3b8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar14 == '\0') {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  }
  else {
    local_3b0._0_8_ = (pointer)0x1;
    paStack_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3b0 + 0x10);
    local_3b0[0x10] = '.';
    local_3f8._8_8_ = (config->_M_dataplus)._M_p;
    local_3f8._M_allocated_capacity = config->_M_string_length;
    _usedResponseFile = (pointer)0x1;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&usedResponseFile;
    local_3b0._8_8_ = paStack_400;
    cmCatViews_abi_cxx11_(&local_210,views_02);
  }
  _usedResponseFile = (pointer)0xb;
  paStack_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x70f77d;
  local_3e8 = local_210._M_string_length;
  local_3e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p;
  local_3d8 = 4;
  local_3d0 = ".rsp";
  views_03._M_len = 4;
  views_03._M_array = (iterator)&usedResponseFile;
  local_3f8._M_allocated_capacity = sVar6;
  local_3f8._8_8_ = pcVar3;
  cmCatViews_abi_cxx11_(&local_250,views_03);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar15,&local_250);
  std::__cxx11::string::_M_assign((string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &local_98,config,config,DependOnTargetArtifact);
  _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (local_3b8,(ostream *)os,(cmNinjaBuild *)local_150,(int)sVar20 - iVar12,
             &usedResponseFile);
  WriteNvidiaDeviceLinkRule(this,usedResponseFile,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.SharedObject._M_dataplus._M_p != &tgtNames.SharedObject.field_2) {
    operator_delete(tgtNames.SharedObject._M_dataplus._M_p,
                    tgtNames.SharedObject.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.PDB._M_dataplus._M_p != &tgtNames.PDB.field_2) {
    operator_delete(tgtNames.PDB._M_dataplus._M_p,tgtNames.PDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.ImportLibrary._M_dataplus._M_p != &tgtNames.ImportLibrary.field_2) {
    operator_delete(tgtNames.ImportLibrary._M_dataplus._M_p,
                    tgtNames.ImportLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Real._M_dataplus._M_p != &tgtNames.Real.field_2) {
    operator_delete(tgtNames.Real._M_dataplus._M_p,tgtNames.Real.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Output._M_dataplus._M_p != &tgtNames.Output.field_2) {
    operator_delete(tgtNames.Output._M_dataplus._M_p,
                    tgtNames.Output.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_150);
LAB_003a253e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] = globalGen->EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}